

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O3

ze_result_t zesFanGetConfig(zes_fan_handle_t hFan,zes_fan_config_t *pConfig)

{
  code *UNRECOVERED_JUMPTABLE;
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (ze_lib::destruction == '\0') {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(ze_lib::context + 0x20) + 0x3d0);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar1 = (*UNRECOVERED_JUMPTABLE)();
      return zVar1;
    }
    zVar1 = (uint)*(byte *)(ze_lib::context + 0xd90) * 2 + ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zVar1;
}

Assistant:

ze_result_t ZE_APICALL
zesFanGetConfig(
    zes_fan_handle_t hFan,                          ///< [in] Handle for the component.
    zes_fan_config_t* pConfig                       ///< [in,out] Will contain the current configuration of the fan.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFanGetConfig_t pfnGetConfig = [&result] {
        auto pfnGetConfig = ze_lib::context->zesDdiTable.load()->Fan.pfnGetConfig;
        if( nullptr == pfnGetConfig ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetConfig;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetConfig( hFan, pConfig );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetConfig = ze_lib::context->zesDdiTable.load()->Fan.pfnGetConfig;
    if( nullptr == pfnGetConfig ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetConfig( hFan, pConfig );
    #endif
}